

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O1

bool __thiscall
EnrichableAnalyzerSubprocess::GetInputLine
          (EnrichableAnalyzerSubprocess *this,char *buffer,uint bufferLength)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    read(this->inpipefd[0],buffer + uVar1,1);
    uVar3 = (ulong)uVar1;
    uVar2 = (buffer[uVar3] != '\n') + uVar1;
    if (uVar1 == bufferLength - 2) break;
    uVar1 = uVar2;
  } while (buffer[uVar3] != '\n');
  buffer[uVar2] = '\0';
  return *buffer != '\0';
}

Assistant:

bool EnrichableAnalyzerSubprocess::GetInputLine(char* buffer, unsigned bufferLength) {
	unsigned bufferPos = 0;
	bool result = false;

	#ifdef SUBPROCESS_DEBUG
		std::cerr << "<< ";
	#endif

	while(true) {
		int result = read(inpipefd[0], &buffer[bufferPos], 1);
		if(buffer[bufferPos] == '\n') {
			break;
		}

		#ifdef SUBPROCESS_DEBUG
			std::cerr << buffer[bufferPos];
		#endif

		bufferPos++;

		if(bufferPos == bufferLength - 1) {
			break;
		}
	}
	buffer[bufferPos] = '\0';

	#ifdef SUBPROCESS_DEBUG
		std::cerr << '\n';
	#endif

	if(strlen(buffer) > 0) {
		result = true;
	}

	return result;
}